

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.h
# Opt level: O2

char * __thiscall tinyxml2::DynArray<char,_20>::PushArr(DynArray<char,_20> *this,int count)

{
  int iVar1;
  
  EnsureCapacity(this,this->_size + count);
  iVar1 = this->_size;
  this->_size = count + iVar1;
  return this->_mem + iVar1;
}

Assistant:

T* PushArr( int count ) {
        TIXMLASSERT( count >= 0 );
        TIXMLASSERT( _size <= INT_MAX - count );
        EnsureCapacity( _size+count );
        T* ret = &_mem[_size];
        _size += count;
        return ret;
    }